

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

string * __thiscall
svg::Color::toString_abi_cxx11_(string *__return_storage_ptr__,Color *this,Layout *param_1)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = local_198;
  if (this->transparent == false) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"rgb(",4);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->red);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->green);
    lVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->blue);
    pcVar2 = ")";
  }
  else {
    lVar3 = 4;
    pcVar2 = "none";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const &) const
        {
            std::stringstream ss;
            if (transparent)
                ss << "none";
            else
                ss << "rgb(" << red << "," << green << "," << blue << ")";
            return ss.str();
        }